

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

bool __thiscall TiXmlNode::RemoveChild(TiXmlNode *this,TiXmlNode *removeThis)

{
  TiXmlNode *pTVar1;
  TiXmlNode **ppTVar2;
  
  if (removeThis != (TiXmlNode *)0x0) {
    if (removeThis->parent != this) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                    ,0x157,"bool TiXmlNode::RemoveChild(TiXmlNode *)");
    }
    pTVar1 = removeThis->next;
    ppTVar2 = &pTVar1->prev;
    if (pTVar1 == (TiXmlNode *)0x0) {
      ppTVar2 = &this->lastChild;
    }
    *ppTVar2 = removeThis->prev;
    ppTVar2 = &this->firstChild;
    if (removeThis->prev != (TiXmlNode *)0x0) {
      ppTVar2 = &removeThis->prev->next;
    }
    *ppTVar2 = pTVar1;
    (*(removeThis->super_TiXmlBase)._vptr_TiXmlBase[1])(removeThis);
  }
  return removeThis != (TiXmlNode *)0x0;
}

Assistant:

bool TiXmlNode::RemoveChild( TiXmlNode* removeThis )
{
	if ( !removeThis ) {
		return false;
	}

	if ( removeThis->parent != this )
	{	
		assert( 0 );
		return false;
	}

	if ( removeThis->next )
		removeThis->next->prev = removeThis->prev;
	else
		lastChild = removeThis->prev;

	if ( removeThis->prev )
		removeThis->prev->next = removeThis->next;
	else
		firstChild = removeThis->next;

	delete removeThis;
	return true;
}